

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_8x8_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ushort uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  longlong lVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  longlong lVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar65;
  uint uVar66;
  int iVar67;
  undefined1 (*pauVar68) [16];
  long lVar69;
  undefined1 (*pauVar70) [16];
  longlong *plVar71;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  int i_2;
  __m128i d [8];
  __m128i dstvec [8];
  __m128i atmp3;
  __m128i atmp2;
  __m128i atmp1;
  __m128i atmp0;
  __m128i mask;
  int i;
  int base;
  __m256i shift;
  __m256i res1;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i mask256;
  __m256i base_inc256;
  __m256i max_base_x256;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i c3f;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int i_1;
  int base_1;
  __m256i shift_1;
  __m256i res1_1;
  __m256i res_1;
  __m256i b_1;
  int r_1;
  int x_1;
  __m256i mask256_1;
  __m256i base_inc256_1;
  __m256i max_base_x256_1;
  __m256i diff_1;
  __m256i a_mbase_x_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a0_1;
  __m256i a1_2;
  __m256i a0_2;
  int max_base_x_1;
  int frac_bits_1;
  __m128i *in_stack_ffffffffffffe8b0;
  undefined4 in_stack_ffffffffffffe8e0;
  uint in_stack_ffffffffffffe8e4;
  uint in_stack_ffffffffffffe8e8;
  undefined4 in_stack_ffffffffffffe8ec;
  uint in_stack_ffffffffffffe8f0;
  uint in_stack_ffffffffffffe8f4;
  undefined4 in_stack_ffffffffffffe8f8;
  undefined4 in_stack_ffffffffffffe8fc;
  undefined2 in_stack_ffffffffffffe900;
  ushort in_stack_ffffffffffffe902;
  uint in_stack_ffffffffffffe904;
  int in_stack_ffffffffffffe908;
  undefined2 in_stack_ffffffffffffe90c;
  undefined2 in_stack_ffffffffffffe90e;
  undefined2 in_stack_ffffffffffffe910;
  ushort in_stack_ffffffffffffe912;
  ushort in_stack_ffffffffffffe914;
  undefined1 in_stack_ffffffffffffe916;
  undefined1 in_stack_ffffffffffffe917;
  int in_stack_ffffffffffffe918;
  undefined2 in_stack_ffffffffffffe91c;
  undefined2 in_stack_ffffffffffffe91e;
  ushort in_stack_ffffffffffffe920;
  ushort in_stack_ffffffffffffe922;
  undefined2 in_stack_ffffffffffffe924;
  ushort in_stack_ffffffffffffe926;
  int local_16d4;
  longlong local_16d0 [36];
  long local_15b0;
  long local_15a8;
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  int local_1548;
  int local_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  int local_14a8;
  uint local_14a4;
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [32];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  longlong local_1400;
  longlong lStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [16];
  undefined1 auStack_13d0 [16];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined1 auStack_1370 [16];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined1 auStack_1350 [16];
  uint local_1328;
  int local_1324;
  byte local_131c;
  longlong *local_1310;
  undefined4 local_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  ushort local_126c;
  ushort local_126a;
  undefined2 local_1268;
  ushort local_1266;
  ushort local_1264;
  undefined2 local_1262;
  longlong local_1260;
  longlong lStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  longlong local_1240;
  longlong lStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  uint8_t local_1200 [8];
  uint8_t auStack_11f8 [8];
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  uint8_t local_11e0 [8];
  uint8_t auStack_11d8 [8];
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  uint8_t local_11c0 [8];
  uint8_t auStack_11b8 [8];
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  uint8_t local_11a0 [8];
  uint8_t auStack_1198 [8];
  undefined8 local_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [16];
  undefined1 auStack_1170 [16];
  undefined2 local_1160;
  undefined2 local_115e;
  undefined2 local_115c;
  undefined2 local_115a;
  undefined2 local_1158;
  undefined2 local_1156;
  undefined2 local_1154;
  undefined2 local_1152;
  undefined2 local_1150;
  undefined2 local_114e;
  undefined2 local_114c;
  undefined2 local_114a;
  undefined2 local_1148;
  undefined2 local_1146;
  undefined2 local_1144;
  undefined2 local_1142;
  undefined1 local_1140 [16];
  undefined1 auStack_1130 [16];
  ushort local_1120;
  ushort local_111e;
  ushort local_111c;
  ushort local_111a;
  ushort local_1118;
  ushort local_1116;
  ushort local_1114;
  ushort local_1112;
  ushort local_1110;
  ushort local_110e;
  ushort local_110c;
  ushort local_110a;
  ushort local_1108;
  ushort local_1106;
  ushort local_1104;
  ushort local_1102;
  undefined1 local_1100 [16];
  undefined1 auStack_10f0 [16];
  ushort local_10e0;
  ushort local_10de;
  ushort local_10dc;
  ushort local_10da;
  ushort local_10d8;
  ushort local_10d6;
  ushort local_10d4;
  ushort local_10d2;
  ushort local_10d0;
  ushort local_10ce;
  ushort local_10cc;
  ushort local_10ca;
  ushort local_10c8;
  ushort local_10c6;
  ushort local_10c4;
  ushort local_10c2;
  undefined1 local_10c0 [32];
  undefined2 local_10a0;
  undefined2 local_109e;
  undefined2 local_109c;
  undefined2 local_109a;
  undefined2 local_1098;
  undefined2 local_1096;
  undefined2 local_1094;
  undefined2 local_1092;
  undefined2 local_1090;
  undefined2 local_108e;
  undefined2 local_108c;
  undefined2 local_108a;
  undefined2 local_1088;
  undefined2 local_1086;
  undefined2 local_1084;
  undefined2 local_1082;
  undefined1 local_1080 [32];
  ushort local_1060;
  ushort local_105e;
  ushort local_105c;
  ushort local_105a;
  ushort local_1058;
  ushort local_1056;
  ushort local_1054;
  ushort local_1052;
  ushort local_1050;
  ushort local_104e;
  ushort local_104c;
  ushort local_104a;
  ushort local_1048;
  ushort local_1046;
  ushort local_1044;
  ushort local_1042;
  undefined1 local_1040 [32];
  ushort local_1020;
  ushort local_101e;
  ushort local_101c;
  ushort local_101a;
  ushort local_1018;
  ushort local_1016;
  ushort local_1014;
  ushort local_1012;
  ushort local_1010;
  ushort local_100e;
  ushort local_100c;
  ushort local_100a;
  ushort local_1008;
  ushort local_1006;
  ushort local_1004;
  ushort local_1002;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [16];
  undefined1 auStack_f70 [16];
  undefined1 local_f60 [16];
  undefined1 auStack_f50 [16];
  undefined1 local_f40 [16];
  undefined1 auStack_f30 [16];
  undefined1 local_f20 [32];
  undefined1 (*local_f00) [16];
  undefined1 (*local_ef8) [16];
  undefined1 (*local_ef0) [16];
  undefined4 local_ee4;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined4 local_ea4;
  undefined1 local_ea0 [32];
  undefined4 local_e64;
  undefined1 local_e60 [32];
  undefined4 local_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined1 local_de0 [16];
  undefined1 auStack_dd0 [16];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  int local_d08;
  uint local_d04;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  int local_c68;
  uint local_c64;
  undefined1 local_c60 [32];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined1 local_c00 [32];
  longlong local_be0;
  longlong lStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [32];
  undefined1 auStack_b70 [16];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [24];
  undefined8 uStack_b08;
  uint local_ae8;
  int local_ae4;
  longlong *local_ad0;
  undefined4 local_ac8;
  ushort local_ac2;
  longlong local_ac0;
  longlong lStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  longlong local_a60;
  longlong lStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [16];
  undefined1 auStack_9f0 [16];
  ushort local_9e0;
  ushort local_9de;
  ushort local_9dc;
  ushort local_9da;
  ushort local_9d8;
  ushort local_9d6;
  ushort local_9d4;
  ushort local_9d2;
  ushort local_9d0;
  ushort local_9ce;
  ushort local_9cc;
  ushort local_9ca;
  ushort local_9c8;
  ushort local_9c6;
  ushort local_9c4;
  ushort local_9c2;
  undefined1 local_9c0 [16];
  undefined1 auStack_9b0 [16];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined1 auStack_970 [16];
  undefined1 local_960 [32];
  undefined1 (*local_940) [16];
  undefined1 (*local_938) [16];
  undefined1 (*local_930) [16];
  undefined4 local_928;
  uint local_924;
  undefined4 local_920;
  uint local_91c;
  uint local_918;
  undefined4 local_914;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined1 local_820 [32];
  uint local_800;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  uint local_7f0;
  uint local_7ec;
  uint local_7e8;
  uint local_7e4;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  uint local_7c0;
  uint local_7bc;
  uint local_7b8;
  uint local_7b4;
  uint local_7b0;
  uint local_7ac;
  uint local_7a8;
  uint local_7a4;
  undefined1 local_7a0 [32];
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  uint local_740;
  uint local_73c;
  uint local_738;
  uint local_734;
  uint local_730;
  uint local_72c;
  uint local_728;
  uint local_724;
  undefined1 local_720 [32];
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined1 local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined4 local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined4 local_604;
  undefined1 local_600 [32];
  undefined4 local_5c4;
  undefined1 local_5c0 [32];
  undefined4 local_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint8_t local_3e0 [8];
  uint8_t auStack_3d8 [8];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  uint8_t local_3c0 [8];
  uint8_t auStack_3b8 [22];
  undefined1 local_3a2;
  undefined1 local_3a1;
  undefined2 local_3a0;
  undefined2 local_39e;
  undefined2 local_39c;
  undefined2 local_39a;
  undefined2 local_398;
  undefined2 local_396;
  undefined2 local_394;
  undefined2 local_392;
  ushort local_390;
  ushort local_38e;
  ushort local_38c;
  ushort local_38a;
  ushort local_388;
  ushort local_386;
  ushort local_384;
  ushort local_382;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  ushort local_360;
  ushort local_35e;
  ushort local_35c;
  ushort local_35a;
  ushort local_358;
  ushort local_356;
  ushort local_354;
  ushort local_352;
  undefined2 local_350;
  undefined2 local_34e;
  undefined2 local_34c;
  undefined2 local_34a;
  undefined2 local_348;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  undefined2 local_340;
  undefined2 local_33e;
  undefined2 local_33c;
  undefined2 local_33a;
  undefined2 local_338;
  undefined2 local_336;
  undefined2 local_334;
  undefined2 local_332;
  ushort local_330;
  ushort local_32e;
  ushort local_32c;
  ushort local_32a;
  ushort local_328;
  ushort local_326;
  ushort local_324;
  ushort local_322;
  undefined1 local_320 [16];
  undefined1 auStack_310 [16];
  ushort local_300;
  ushort local_2fe;
  ushort local_2fc;
  ushort local_2fa;
  ushort local_2f8;
  ushort local_2f6;
  ushort local_2f4;
  ushort local_2f2;
  undefined2 local_2f0;
  undefined2 local_2ee;
  undefined2 local_2ec;
  undefined2 local_2ea;
  undefined2 local_2e8;
  undefined2 local_2e6;
  undefined2 local_2e4;
  undefined2 local_2e2;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  longlong local_240;
  longlong lStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1ef;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  uint local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  uint local_1c4;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  uint local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  uint local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  uint local_174;
  int local_170;
  int local_16c;
  int local_168;
  uint local_164;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  uint local_140;
  int local_13c;
  int local_138;
  int local_134;
  uint local_130;
  int local_12c;
  int local_128;
  int local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined1 auStack_110 [16];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 auStack_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar64._8_8_ = auStack_f70._8_8_;
  auVar64._0_8_ = auStack_f70._0_8_;
  auVar63._8_8_ = local_f80._8_8_;
  auVar63._0_8_ = local_f80._0_8_;
  auVar62._8_8_ = auStack_f30._8_8_;
  auVar62._0_8_ = auStack_f30._0_8_;
  auVar61._8_8_ = local_f40._8_8_;
  auVar61._0_8_ = local_f40._0_8_;
  auVar77._24_8_ = auStack_970._8_8_;
  auVar77._16_8_ = auStack_970._0_8_;
  auVar77._8_8_ = local_980._8_8_;
  auVar77._0_8_ = local_980._0_8_;
  auVar78._24_8_ = auStack_9b0._8_8_;
  auVar78._16_8_ = auStack_9b0._0_8_;
  auVar78._8_8_ = local_9c0._8_8_;
  auVar78._0_8_ = local_9c0._0_8_;
  auVar75._24_8_ = auStack_c10._8_8_;
  auVar75._16_8_ = auStack_c10._0_8_;
  auVar75._8_8_ = local_c20._8_8_;
  auVar75._0_8_ = local_c20._0_8_;
  auVar73._24_8_ = auStack_dd0._8_8_;
  auVar73._16_8_ = auStack_dd0._0_8_;
  auVar73._8_8_ = local_de0._8_8_;
  auVar73._0_8_ = local_de0._0_8_;
  auVar74._24_8_ = auStack_f50._8_8_;
  auVar74._16_8_ = auStack_f50._0_8_;
  auVar74._8_8_ = local_f60._8_8_;
  auVar74._0_8_ = local_f60._0_8_;
  auVar72._24_8_ = auStack_13d0._8_8_;
  auVar72._16_8_ = auStack_13d0._0_8_;
  auVar72._8_8_ = local_13e0._8_8_;
  auVar72._0_8_ = local_13e0._0_8_;
  local_131c = (byte)in_ECX;
  if (in_R9D < 0xc) {
    local_1304 = 8;
    plVar71 = local_16d0 + 0x10;
    iVar65 = 6 - in_ECX;
    uVar66 = 0xf << (local_131c & 0x1f);
    local_1262 = 0x10;
    in_stack_ffffffffffffe924 = 0x10;
    local_1142 = 0x10;
    local_1144 = 0x10;
    local_1146 = 0x10;
    local_1148 = 0x10;
    local_114a = 0x10;
    local_114c = 0x10;
    local_114e = 0x10;
    local_1150 = 0x10;
    local_1152 = 0x10;
    local_1154 = 0x10;
    local_1156 = 0x10;
    local_1158 = 0x10;
    local_115a = 0x10;
    local_115c = 0x10;
    local_115e = 0x10;
    local_1160 = 0x10;
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,6);
    auVar2 = vpinsrw_avx(auVar72._0_16_,0x10,7);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x10,6);
    auVar3 = vpinsrw_avx(auVar72._0_16_,0x10,7);
    local_1180._0_8_ = auVar2._0_8_;
    local_1180._8_8_ = auVar2._8_8_;
    auStack_1170._0_8_ = auVar3._0_8_;
    auStack_1170._8_8_ = auVar3._8_8_;
    local_13c0 = local_1180._0_8_;
    uStack_13b8 = local_1180._8_8_;
    uStack_13b0 = auStack_1170._0_8_;
    uStack_13a8 = auStack_1170._8_8_;
    in_stack_ffffffffffffe926 = *(ushort *)(in_RDX + (long)(int)uVar66 * 2);
    auVar72._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe926),(uint)in_stack_ffffffffffffe926,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,6);
    auVar4 = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,7);
    auVar72._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe926),(uint)in_stack_ffffffffffffe926,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,6);
    auVar5 = vpinsrw_avx(auVar72._0_16_,(uint)in_stack_ffffffffffffe926,7);
    local_1140._0_8_ = auVar4._0_8_;
    local_1140._8_8_ = auVar4._8_8_;
    auStack_1130._0_8_ = auVar5._0_8_;
    auStack_1130._8_8_ = auVar5._8_8_;
    local_1400 = local_1140._0_8_;
    lStack_13f8 = local_1140._8_8_;
    uStack_13f0 = auStack_1130._0_8_;
    uStack_13e8 = auStack_1130._8_8_;
    local_1328._0_2_ = (ushort)uVar66;
    local_1266 = (ushort)local_1328;
    local_10c2 = (ushort)local_1328;
    local_10c4 = (ushort)local_1328;
    local_10c6 = (ushort)local_1328;
    local_10c8 = (ushort)local_1328;
    local_10ca = (ushort)local_1328;
    local_10cc = (ushort)local_1328;
    local_10ce = (ushort)local_1328;
    local_10d0 = (ushort)local_1328;
    local_10d2 = (ushort)local_1328;
    local_10d4 = (ushort)local_1328;
    local_10d6 = (ushort)local_1328;
    local_10d8 = (ushort)local_1328;
    local_10da = (ushort)local_1328;
    local_10dc = (ushort)local_1328;
    local_10de = (ushort)local_1328;
    local_10e0 = (ushort)local_1328;
    auVar72._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1328),uVar66 & 0xffff,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,6);
    auVar6 = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,7);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_1328),uVar66 & 0xffff,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,6);
    auVar7 = vpinsrw_avx(auVar72._0_16_,uVar66 & 0xffff,7);
    local_1100._0_8_ = auVar6._0_8_;
    local_1100._8_8_ = auVar6._8_8_;
    auStack_10f0._0_8_ = auVar7._0_8_;
    auStack_10f0._8_8_ = auVar7._8_8_;
    local_1440 = local_1100._0_8_;
    uStack_1438 = local_1100._8_8_;
    uStack_1430 = auStack_10f0._0_8_;
    uStack_1428 = auStack_10f0._8_8_;
    local_1268 = 0x3f;
    local_1082 = 0x3f;
    local_1084 = 0x3f;
    local_1086 = 0x3f;
    local_1088 = 0x3f;
    local_108a = 0x3f;
    local_108c = 0x3f;
    local_108e = 0x3f;
    local_1090 = 0x3f;
    local_1092 = 0x3f;
    local_1094 = 0x3f;
    local_1096 = 0x3f;
    local_1098 = 0x3f;
    local_109a = 0x3f;
    local_109c = 0x3f;
    local_109e = 0x3f;
    local_10a0 = 0x3f;
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,6);
    auVar72._16_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,7);
    auVar72._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,2);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,3);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,4);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,5);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,6);
    auVar72._0_16_ = vpinsrw_avx(auVar72._0_16_,0x3f,7);
    auVar72._0_16_ = ZEXT116(0) * auVar72._16_16_ + ZEXT116(1) * auVar72._0_16_;
    auVar72._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar72._16_16_;
    local_10c0._16_8_ = auVar72._16_8_;
    local_10c0._24_8_ = auVar72._24_8_;
    local_14a4 = in_R8D;
    for (local_14a8 = 0; local_1328 = uVar66, local_1324 = iVar65, local_1310 = plVar71,
        local_1264 = in_stack_ffffffffffffe926, local_1120 = in_stack_ffffffffffffe926,
        local_111e = in_stack_ffffffffffffe926, local_111c = in_stack_ffffffffffffe926,
        local_111a = in_stack_ffffffffffffe926, local_1118 = in_stack_ffffffffffffe926,
        local_1116 = in_stack_ffffffffffffe926, local_1114 = in_stack_ffffffffffffe926,
        local_1112 = in_stack_ffffffffffffe926, local_1110 = in_stack_ffffffffffffe926,
        local_110e = in_stack_ffffffffffffe926, local_110c = in_stack_ffffffffffffe926,
        local_110a = in_stack_ffffffffffffe926, local_1108 = in_stack_ffffffffffffe926,
        local_1106 = in_stack_ffffffffffffe926, local_1104 = in_stack_ffffffffffffe926,
        local_1102 = in_stack_ffffffffffffe926, auVar13 = auVar72, auVar9 = auStack_9f0,
        auVar79 = local_860, auVar1 = auStack_850, auVar10 = local_820, local_14a8 < 8;
        local_14a8 = local_14a8 + 1) {
      iVar67 = (int)local_14a4 >> ((byte)iVar65 & 0x1f);
      local_1544 = iVar67;
      if ((int)uVar66 <= iVar67) {
        for (local_1548 = local_14a8; local_1548 < 8; local_1548 = local_1548 + 1) {
          plVar71[(long)local_1548 * 2] = local_1140._0_8_;
          local_16d0[(long)local_1548 * 2 + 0x11] = local_1140._8_8_;
          local_1240 = local_1140._0_8_;
          lStack_1238 = local_1140._8_8_;
          uStack_1230 = auStack_1130._0_8_;
          uStack_1228 = auStack_1130._8_8_;
        }
        break;
      }
      pauVar68 = (undefined1 (*) [16])(in_RDX + (long)iVar67 * 2);
      local_1490 = *pauVar68;
      uVar16 = (ushort)iVar67;
      if (in_ECX == 0) {
        local_f00 = (undefined1 (*) [16])(in_RDX + 2 + (long)iVar67 * 2);
        local_14a0 = *local_f00;
        local_324 = uVar16 + 1;
        local_326 = uVar16 + 2;
        local_328 = uVar16 + 3;
        local_32a = uVar16 + 4;
        local_32c = uVar16 + 5;
        local_32e = uVar16 + 6;
        local_330 = uVar16 + 7;
        local_332 = 0;
        local_334 = 0;
        local_336 = 0;
        local_338 = 0;
        local_33a = 0;
        local_33c = 0;
        local_33e = 0;
        local_340 = 0;
        in_stack_ffffffffffffe90e = 0;
        in_stack_ffffffffffffe910 = 0;
        local_2e2 = 0;
        local_2e4 = 0;
        local_2e6 = 0;
        local_2e8 = 0;
        local_2ea = 0;
        local_2ec = 0;
        local_2ee = 0;
        local_2f0 = 0;
        auVar74._0_16_ = vpinsrw_avx(ZEXT216(uVar16),(uint)local_324,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_326,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_328,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_32a,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_32c,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,(uint)local_32e,6);
        local_320 = vpinsrw_avx(auVar74._0_16_,(uint)local_330,7);
        auVar74._0_16_ = vpinsrw_avx(ZEXT216(0),0,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,0,6);
        auStack_310 = vpinsrw_avx(auVar74._0_16_,0,7);
        local_1460 = local_320._0_8_;
        uStack_1458 = local_320._8_8_;
        uStack_1450 = auStack_310._0_8_;
        uStack_1448 = auStack_310._8_8_;
        local_126c = (ushort)local_14a4;
        local_1002 = (ushort)local_14a4;
        local_1004 = (ushort)local_14a4;
        local_1006 = (ushort)local_14a4;
        local_1008 = (ushort)local_14a4;
        local_100a = (ushort)local_14a4;
        local_100c = (ushort)local_14a4;
        local_100e = (ushort)local_14a4;
        local_1010 = (ushort)local_14a4;
        local_1012 = (ushort)local_14a4;
        local_1014 = (ushort)local_14a4;
        local_1016 = (ushort)local_14a4;
        local_1018 = (ushort)local_14a4;
        local_101a = (ushort)local_14a4;
        local_101c = (ushort)local_14a4;
        local_101e = (ushort)local_14a4;
        local_1020 = (ushort)local_14a4;
        auVar74._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,6);
        auVar74._16_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,7);
        auVar74._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,2);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,3);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,4);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,5);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,6);
        auVar74._0_16_ = vpinsrw_avx(auVar74._0_16_,local_14a4 & 0xffff,7);
        auVar74._0_16_ = ZEXT116(0) * auVar74._16_16_ + ZEXT116(1) * auVar74._0_16_;
        auVar74._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74._16_16_;
        local_1040._16_8_ = auVar74._16_8_;
        local_1040._24_8_ = auVar74._24_8_;
        auVar48._16_8_ = local_1040._16_8_;
        auVar48._0_16_ = auVar74._0_16_;
        auVar48._24_8_ = local_1040._24_8_;
        auVar47._16_8_ = local_10c0._16_8_;
        auVar47._0_16_ = auVar72._0_16_;
        auVar47._24_8_ = local_10c0._24_8_;
        local_ea0 = vpand_avx2(auVar48,auVar47);
        local_ea4 = 1;
        local_1540 = vpsrlw_avx2(local_ea0,ZEXT416(1));
        in_stack_ffffffffffffe908 = iVar67;
        in_stack_ffffffffffffe912 = uVar16;
        in_stack_ffffffffffffe914 = (ushort)local_14a4;
        local_1040 = auVar74;
        local_322 = uVar16;
        local_300 = uVar16;
        local_2fe = local_324;
        local_2fc = local_326;
        local_2fa = local_328;
        local_2f8 = local_32a;
        local_2f6 = local_32c;
        local_2f4 = local_32e;
        local_2f2 = local_330;
        auVar63 = auVar72._0_16_;
        auVar64 = auVar72._16_16_;
      }
      else {
        local_ef8 = (undefined1 (*) [16])(in_RDX + 0x10 + (long)iVar67 * 2);
        local_11f0 = *(undefined8 *)*local_ef8;
        uStack_11e8 = *(undefined8 *)(*local_ef8 + 8);
        local_11a0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_1198 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar9._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar9._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_1570 = vpshufb_avx(*pauVar68,auVar9);
        local_11c0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_11b8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._8_8_;
        auVar8._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar8._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        local_1580 = vpshufb_avx(*local_ef8,auVar8);
        local_11e0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_11d8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar1._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar1._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1590 = vpshufb_avx(*pauVar68,auVar1);
        local_1200 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_11f8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        auVar79._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar79._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_15a0 = vpshufb_avx(*local_ef8,auVar79);
        local_3a1 = 0xf;
        in_stack_ffffffffffffe916 = 0xf;
        local_201 = 0xf;
        local_202 = 0xf;
        local_203 = 0xf;
        local_204 = 0xf;
        local_205 = 0xf;
        local_206 = 0xf;
        local_207 = 0xf;
        local_208 = 0xf;
        local_209 = 0xf;
        local_20a = 0xf;
        local_20b = 0xf;
        local_20c = 0xf;
        local_20d = 0xf;
        local_20e = 0xf;
        local_20f = 0xf;
        local_210 = 0xf;
        auVar73._0_16_ = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,2);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,3);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,4);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,5);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,6);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,7);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,8);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,9);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,10);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xb);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xc);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xd);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xe);
        local_220 = vpinsrb_avx(auVar73._0_16_,0xf,0xf);
        local_3c0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._0_8_;
        auStack_3b8._0_8_ = HighbdEvenOddMaskx[0]._8_8_;
        local_3d0 = local_220._0_8_;
        uStack_3c8 = local_220._8_8_;
        auVar54._8_8_ = HighbdEvenOddMaskx[0]._8_8_;
        auVar54._0_8_ = HighbdEvenOddMaskx[0]._0_8_;
        auVar73._0_16_ = vpcmpgtb_avx(auVar54,local_220);
        local_1560._0_8_ = auVar73._0_8_;
        local_1560._8_8_ = auVar73._8_8_;
        local_d20 = local_1570._0_8_;
        uStack_d18 = local_1570._8_8_;
        local_d30 = local_1580._0_8_;
        uStack_d28 = local_1580._8_8_;
        local_d40 = local_1560._0_8_;
        uStack_d38 = local_1560._8_8_;
        local_1490 = vpblendvb_avx(local_1570,local_1580,auVar73._0_16_);
        local_3a2 = 0xf;
        in_stack_ffffffffffffe917 = 0xf;
        local_1e1 = 0xf;
        local_1e2 = 0xf;
        local_1e3 = 0xf;
        local_1e4 = 0xf;
        local_1e5 = 0xf;
        local_1e6 = 0xf;
        local_1e7 = 0xf;
        local_1e8 = 0xf;
        local_1e9 = 0xf;
        local_1ea = 0xf;
        local_1eb = 0xf;
        local_1ec = 0xf;
        local_1ed = 0xf;
        local_1ee = 0xf;
        local_1ef = 0xf;
        local_1f0 = 0xf;
        auVar73._0_16_ = vpinsrb_avx(ZEXT116(0xf),0xf,1);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,2);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,3);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,4);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,5);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,6);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,7);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,8);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,9);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,10);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xb);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xc);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xd);
        auVar73._0_16_ = vpinsrb_avx(auVar73._0_16_,0xf,0xe);
        local_200 = vpinsrb_avx(auVar73._0_16_,0xf,0xf);
        local_3e0 = (uint8_t  [8])HighbdEvenOddMaskx[0]._16_8_;
        auStack_3d8 = (uint8_t  [8])HighbdEvenOddMaskx[0]._24_8_;
        local_3f0 = local_200._0_8_;
        uStack_3e8 = local_200._8_8_;
        auVar53._8_8_ = HighbdEvenOddMaskx[0]._24_8_;
        auVar53._0_8_ = HighbdEvenOddMaskx[0]._16_8_;
        local_1560 = vpcmpgtb_avx(auVar53,local_200);
        local_d50 = local_1590._0_8_;
        uStack_d48 = local_1590._8_8_;
        local_d60 = local_15a0._0_8_;
        uStack_d58 = local_15a0._8_8_;
        local_d70 = local_1560._0_8_;
        uStack_d68 = local_1560._8_8_;
        local_14a0 = vpblendvb_avx(local_1590,local_15a0,local_1560);
        local_384 = uVar16 + 2;
        local_386 = uVar16 + 4;
        local_388 = uVar16 + 6;
        local_38a = uVar16 + 8;
        local_38c = uVar16 + 10;
        local_38e = uVar16 + 0xc;
        local_390 = uVar16 + 0xe;
        local_392 = 0;
        local_394 = 0;
        local_396 = 0;
        local_398 = 0;
        local_39a = 0;
        local_39c = 0;
        local_39e = 0;
        local_3a0 = 0;
        in_stack_ffffffffffffe91c = 0;
        in_stack_ffffffffffffe91e = 0;
        local_342 = 0;
        local_344 = 0;
        local_346 = 0;
        local_348 = 0;
        local_34a = 0;
        local_34c = 0;
        local_34e = 0;
        local_350 = 0;
        auVar73._0_16_ = vpinsrw_avx(ZEXT216(uVar16),(uint)local_384,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_386,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_388,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_38a,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_38c,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,(uint)local_38e,6);
        local_380 = vpinsrw_avx(auVar73._0_16_,(uint)local_390,7);
        auVar73._0_16_ = vpinsrw_avx(ZEXT216(0),0,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,0,6);
        auStack_370 = vpinsrw_avx(auVar73._0_16_,0,7);
        local_1460 = local_380._0_8_;
        uStack_1458 = local_380._8_8_;
        uStack_1450 = auStack_370._0_8_;
        uStack_1448 = auStack_370._8_8_;
        local_126a = (ushort)local_14a4;
        local_1042 = (ushort)local_14a4;
        local_1044 = (ushort)local_14a4;
        local_1046 = (ushort)local_14a4;
        local_1048 = (ushort)local_14a4;
        local_104a = (ushort)local_14a4;
        local_104c = (ushort)local_14a4;
        local_104e = (ushort)local_14a4;
        local_1050 = (ushort)local_14a4;
        local_1052 = (ushort)local_14a4;
        local_1054 = (ushort)local_14a4;
        local_1056 = (ushort)local_14a4;
        local_1058 = (ushort)local_14a4;
        local_105a = (ushort)local_14a4;
        local_105c = (ushort)local_14a4;
        local_105e = (ushort)local_14a4;
        local_1060 = (ushort)local_14a4;
        auVar73._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,6);
        auVar73._16_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,7);
        auVar73._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_14a4),local_14a4 & 0xffff,1);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,2);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,3);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,4);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,5);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,6);
        auVar73._0_16_ = vpinsrw_avx(auVar73._0_16_,local_14a4 & 0xffff,7);
        auVar73._0_16_ = ZEXT116(0) * auVar73._16_16_ + ZEXT116(1) * auVar73._0_16_;
        auVar73._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73._16_16_;
        local_1080._16_8_ = auVar73._16_8_;
        local_1080._24_8_ = auVar73._24_8_;
        auVar51._16_8_ = local_1080._16_8_;
        auVar51._0_16_ = auVar73._0_16_;
        auVar51._24_8_ = local_1080._24_8_;
        local_f20 = vpsllw_avx2(auVar51,ZEXT416(in_ECX));
        auVar49._16_8_ = local_10c0._16_8_;
        auVar49._0_16_ = auVar72._0_16_;
        auVar49._24_8_ = local_10c0._24_8_;
        local_e60 = vpand_avx2(local_f20,auVar49);
        local_e64 = 1;
        local_1540 = vpsrlw_avx2(local_e60,ZEXT416(1));
        in_stack_ffffffffffffe918 = iVar67;
        in_stack_ffffffffffffe920 = uVar16;
        in_stack_ffffffffffffe922 = (ushort)local_14a4;
        local_11d0 = *(undefined8 *)*pauVar68;
        uStack_11c8 = *(undefined8 *)(*pauVar68 + 8);
        local_11b0 = local_11f0;
        uStack_11a8 = uStack_11e8;
        local_1190 = *(undefined8 *)*pauVar68;
        uStack_1188 = *(undefined8 *)(*pauVar68 + 8);
        local_1080 = auVar73;
        local_382 = uVar16;
        local_360 = uVar16;
        local_35e = local_384;
        local_35c = local_386;
        local_35a = local_388;
        local_358 = local_38a;
        local_356 = local_38c;
        local_354 = local_38e;
        local_352 = local_390;
        auVar61 = auVar72._0_16_;
        auVar62 = auVar72._16_16_;
      }
      auVar79 = ZEXT416(1);
      auStack_1370._0_8_ = auVar79._0_8_;
      uVar26 = auStack_1370._0_8_;
      auVar44._16_8_ = auStack_1370._0_8_;
      auVar44._0_16_ = local_14a0;
      auVar44._24_8_ = 0;
      auVar43._16_8_ = auStack_1370._0_8_;
      auVar43._0_16_ = local_1490;
      auVar43._24_8_ = 0;
      auVar15 = vpsubw_avx2(auVar44,auVar43);
      local_e24 = 5;
      auVar50._16_8_ = auStack_1370._0_8_;
      auVar50._0_16_ = local_1490;
      auVar50._24_8_ = 0;
      auVar13 = vpsllw_avx2(auVar50,ZEXT416(5));
      local_13a0._0_8_ = auVar13._0_8_;
      uVar27 = local_13a0._0_8_;
      local_13a0._8_8_ = auVar13._8_8_;
      uVar17 = local_13a0._8_8_;
      local_13a0._16_8_ = auVar13._16_8_;
      uVar18 = local_13a0._16_8_;
      local_13a0._24_8_ = auVar13._24_8_;
      uVar19 = local_13a0._24_8_;
      auVar42._16_8_ = auStack_1170._0_8_;
      auVar42._0_16_ = auVar2;
      auVar42._24_8_ = auStack_1170._8_8_;
      auVar13 = vpaddw_avx2(auVar13,auVar42);
      local_1420._0_8_ = auVar15._0_8_;
      uVar20 = local_1420._0_8_;
      local_1420._8_8_ = auVar15._8_8_;
      uVar21 = local_1420._8_8_;
      local_1420._16_8_ = auVar15._16_8_;
      uVar22 = local_1420._16_8_;
      local_1420._24_8_ = auVar15._24_8_;
      uVar23 = local_1420._24_8_;
      auVar12 = vpmullw_avx2(auVar15,local_1540);
      local_13a0._0_8_ = auVar13._0_8_;
      uVar24 = local_13a0._0_8_;
      local_13a0._8_8_ = auVar13._8_8_;
      uVar28 = local_13a0._8_8_;
      local_13a0._16_8_ = auVar13._16_8_;
      uVar29 = local_13a0._16_8_;
      local_13a0._24_8_ = auVar13._24_8_;
      uVar30 = local_13a0._24_8_;
      local_14e0._0_8_ = auVar12._0_8_;
      uVar31 = local_14e0._0_8_;
      local_14e0._8_8_ = auVar12._8_8_;
      uVar32 = local_14e0._8_8_;
      local_14e0._16_8_ = auVar12._16_8_;
      uVar33 = local_14e0._16_8_;
      local_14e0._24_8_ = auVar12._24_8_;
      uVar34 = local_14e0._24_8_;
      auVar10 = vpaddw_avx2(auVar13,auVar12);
      local_1500._0_8_ = auVar10._0_8_;
      uVar35 = local_1500._0_8_;
      local_1500._8_8_ = auVar10._8_8_;
      uVar36 = local_1500._8_8_;
      local_1500._16_8_ = auVar10._16_8_;
      uVar37 = local_1500._16_8_;
      local_1500._24_8_ = auVar10._24_8_;
      uVar38 = local_1500._24_8_;
      local_ee4 = 5;
      auVar14 = vpsrlw_avx2(auVar10,ZEXT416(5));
      auVar46._16_8_ = auStack_10f0._0_8_;
      auVar46._0_16_ = auVar6;
      auVar46._24_8_ = auStack_10f0._8_8_;
      auVar45._8_8_ = uStack_1458;
      auVar45._0_8_ = local_1460;
      auVar45._16_8_ = uStack_1450;
      auVar45._24_8_ = uStack_1448;
      auVar11 = vpcmpgtw_avx2(auVar46,auVar45);
      local_240 = local_1140._0_8_;
      lStack_238 = local_1140._8_8_;
      uStack_230 = auStack_1130._0_8_;
      uStack_228 = auStack_1130._8_8_;
      local_1500._0_8_ = auVar14._0_8_;
      local_260 = local_1500._0_8_;
      local_1500._8_8_ = auVar14._8_8_;
      uStack_258 = local_1500._8_8_;
      local_1500._16_8_ = auVar14._16_8_;
      uStack_250 = local_1500._16_8_;
      local_1500._24_8_ = auVar14._24_8_;
      uStack_248 = local_1500._24_8_;
      local_1480._0_8_ = auVar11._0_8_;
      local_280 = local_1480._0_8_;
      local_1480._8_8_ = auVar11._8_8_;
      uStack_278 = local_1480._8_8_;
      local_1480._16_8_ = auVar11._16_8_;
      uStack_270 = local_1480._16_8_;
      local_1480._24_8_ = auVar11._24_8_;
      uStack_268 = local_1480._24_8_;
      auVar56._16_8_ = auStack_1130._0_8_;
      auVar56._0_16_ = auVar4;
      auVar56._24_8_ = auStack_1130._8_8_;
      auVar10 = vpblendvb_avx2(auVar56,auVar14,auVar11);
      local_1520._0_8_ = auVar10._0_8_;
      lVar25 = local_1520._0_8_;
      local_1520._8_8_ = auVar10._8_8_;
      lVar39 = local_1520._8_8_;
      local_1520._16_8_ = auVar10._16_8_;
      uVar40 = local_1520._16_8_;
      local_1520._24_8_ = auVar10._24_8_;
      uVar41 = local_1520._24_8_;
      plVar71[(long)local_14a8 * 2] = local_1520._0_8_;
      local_16d0[(long)local_14a8 * 2 + 0x11] = local_1520._8_8_;
      local_14a4 = in_R8D + local_14a4;
      local_1520 = auVar10;
      local_1500 = auVar14;
      local_14e0 = auVar12;
      local_1480 = auVar11;
      local_1420 = auVar15;
      local_13a0 = auVar13;
      local_1380 = local_14a0._0_8_;
      uStack_1378 = local_14a0._8_8_;
      auStack_1370 = auVar79;
      local_1360 = local_1490._0_8_;
      uStack_1358 = local_1490._8_8_;
      auStack_1350 = auVar79;
      local_1300 = uVar31;
      uStack_12f8 = uVar32;
      uStack_12f0 = uVar33;
      uStack_12e8 = uVar34;
      local_12e0 = uVar24;
      uStack_12d8 = uVar28;
      uStack_12d0 = uVar29;
      uStack_12c8 = uVar30;
      local_12c0 = local_1180._0_8_;
      uStack_12b8 = local_1180._8_8_;
      uStack_12b0 = auStack_1170._0_8_;
      uStack_12a8 = auStack_1170._8_8_;
      local_12a0 = uVar27;
      uStack_1298 = uVar17;
      uStack_1290 = uVar18;
      uStack_1288 = uVar19;
      local_1260 = lVar25;
      lStack_1258 = lVar39;
      uStack_1250 = uVar40;
      uStack_1248 = uVar41;
      local_1220 = local_14a0._0_8_;
      uStack_1218 = local_14a0._8_8_;
      local_1210 = local_1490._0_8_;
      uStack_1208 = local_1490._8_8_;
      local_1000 = local_1490._0_8_;
      uStack_ff8 = local_1490._8_8_;
      uStack_ff0 = uVar26;
      uStack_fe8 = 0;
      local_fe0 = local_14a0._0_8_;
      uStack_fd8 = local_14a0._8_8_;
      uStack_fd0 = uVar26;
      uStack_fc8 = 0;
      local_fc0 = local_1460;
      uStack_fb8 = uStack_1458;
      uStack_fb0 = uStack_1450;
      uStack_fa8 = uStack_1448;
      local_fa0 = local_1100._0_8_;
      uStack_f98 = local_1100._8_8_;
      uStack_f90 = auStack_10f0._0_8_;
      uStack_f88 = auStack_10f0._8_8_;
      local_ef0 = pauVar68;
      local_ee0 = uVar35;
      uStack_ed8 = uVar36;
      uStack_ed0 = uVar37;
      uStack_ec8 = uVar38;
      local_e20 = local_1490._0_8_;
      uStack_e18 = local_1490._8_8_;
      uStack_e10 = uVar26;
      uStack_e08 = 0;
      local_dc0 = local_1540._0_8_;
      uStack_db8 = local_1540._8_8_;
      uStack_db0 = local_1540._16_8_;
      uStack_da8 = local_1540._24_8_;
      local_da0 = uVar20;
      uStack_d98 = uVar21;
      uStack_d90 = uVar22;
      uStack_d88 = uVar23;
    }
  }
  else {
    local_ac8 = 8;
    plVar71 = local_16d0 + 0x10;
    iVar65 = 6 - in_ECX;
    in_stack_ffffffffffffe904 = 0xf << (local_131c & 0x1f);
    local_914 = 0x10;
    in_stack_ffffffffffffe8fc = 0x10;
    local_824 = 0x10;
    local_828 = 0x10;
    local_82c = 0x10;
    local_830 = 0x10;
    local_834 = 0x10;
    local_838 = 0x10;
    local_83c = 0x10;
    local_840 = 0x10;
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,0x10,2);
    auVar79 = vpinsrd_avx(auVar75._0_16_,0x10,3);
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,0x10,2);
    auVar1 = vpinsrd_avx(auVar75._0_16_,0x10,3);
    local_860._0_8_ = auVar79._0_8_;
    local_860._8_8_ = auVar79._8_8_;
    auStack_850._0_8_ = auVar1._0_8_;
    auStack_850._8_8_ = auVar1._8_8_;
    local_bc0 = local_860._0_8_;
    uStack_bb8 = local_860._8_8_;
    uStack_bb0 = auStack_850._0_8_;
    uStack_ba8 = auStack_850._8_8_;
    in_stack_ffffffffffffe902 = *(ushort *)(in_RDX + (long)(int)in_stack_ffffffffffffe904 * 2);
    auVar75._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe902),(uint)in_stack_ffffffffffffe902,1);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,2);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,3);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,4);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,5);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,6);
    auVar8 = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,7);
    auVar75._0_16_ =
         vpinsrw_avx(ZEXT216(in_stack_ffffffffffffe902),(uint)in_stack_ffffffffffffe902,1);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,2);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,3);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,4);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,5);
    auVar75._0_16_ = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,6);
    auVar9 = vpinsrw_avx(auVar75._0_16_,(uint)in_stack_ffffffffffffe902,7);
    local_a00._0_8_ = auVar8._0_8_;
    uVar26 = local_a00._0_8_;
    local_a00._8_8_ = auVar8._8_8_;
    uVar27 = local_a00._8_8_;
    auStack_9f0._0_8_ = auVar9._0_8_;
    auStack_9f0._8_8_ = auVar9._8_8_;
    local_be0 = local_a00._0_8_;
    lStack_bd8 = local_a00._8_8_;
    uStack_bd0 = auStack_9f0._0_8_;
    uStack_bc8 = auStack_9f0._8_8_;
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe904),in_stack_ffffffffffffe904,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe904,2);
    auVar75._16_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe904,3);
    auVar75._0_16_ = vpinsrd_avx(ZEXT416(in_stack_ffffffffffffe904),in_stack_ffffffffffffe904,1);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe904,2);
    auVar75._0_16_ = vpinsrd_avx(auVar75._0_16_,in_stack_ffffffffffffe904,3);
    auVar75._0_16_ = ZEXT116(0) * auVar75._16_16_ + ZEXT116(1) * auVar75._0_16_;
    auVar75._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75._16_16_;
    local_820._16_8_ = auVar75._16_8_;
    local_820._24_8_ = auVar75._24_8_;
    local_c64 = in_R8D;
    local_a00 = auVar8;
    for (local_c68 = 0; auVar2 = local_1180, auVar3 = auStack_1170, auVar4 = local_1140,
        auVar5 = auStack_1130, auVar6 = local_1100, auVar7 = auStack_10f0, auVar13 = local_10c0,
        local_ae8 = in_stack_ffffffffffffe904, local_ae4 = iVar65, local_ad0 = plVar71,
        local_ac2 = in_stack_ffffffffffffe902, local_9e0 = in_stack_ffffffffffffe902,
        local_9de = in_stack_ffffffffffffe902, local_9dc = in_stack_ffffffffffffe902,
        local_9da = in_stack_ffffffffffffe902, local_9d8 = in_stack_ffffffffffffe902,
        local_9d6 = in_stack_ffffffffffffe902, local_9d4 = in_stack_ffffffffffffe902,
        local_9d2 = in_stack_ffffffffffffe902, local_9d0 = in_stack_ffffffffffffe902,
        local_9ce = in_stack_ffffffffffffe902, local_9cc = in_stack_ffffffffffffe902,
        local_9ca = in_stack_ffffffffffffe902, local_9c8 = in_stack_ffffffffffffe902,
        local_9c6 = in_stack_ffffffffffffe902, local_9c4 = in_stack_ffffffffffffe902,
        local_9c2 = in_stack_ffffffffffffe902, local_918 = in_stack_ffffffffffffe904,
        auVar10 = auVar75, local_800 = in_stack_ffffffffffffe904,
        local_7fc = in_stack_ffffffffffffe904, local_7f8 = in_stack_ffffffffffffe904,
        local_7f4 = in_stack_ffffffffffffe904, local_7f0 = in_stack_ffffffffffffe904,
        local_7ec = in_stack_ffffffffffffe904, local_7e8 = in_stack_ffffffffffffe904,
        local_7e4 = in_stack_ffffffffffffe904, local_c68 < 8; local_c68 = local_c68 + 1) {
      uVar66 = (int)local_c64 >> ((byte)iVar65 & 0x1f);
      local_d04 = uVar66;
      if ((int)in_stack_ffffffffffffe904 <= (int)uVar66) {
        for (local_d08 = local_c68; local_d08 < 8; local_d08 = local_d08 + 1) {
          plVar71[(long)local_d08 * 2] = uVar26;
          local_16d0[(long)local_d08 * 2 + 0x11] = uVar27;
          local_a60 = uVar26;
          lStack_a58 = uVar27;
          uStack_a50 = auStack_9f0._0_8_;
          uStack_a48 = auStack_9f0._8_8_;
        }
        break;
      }
      pauVar68 = (undefined1 (*) [16])(in_RDX + (long)(int)uVar66 * 2);
      uVar17 = *(undefined8 *)*pauVar68;
      uVar18 = *(undefined8 *)(*pauVar68 + 8);
      auVar13 = vpmovzxwd_avx2(*pauVar68);
      lVar69 = in_RDX + (long)(int)uVar66 * 2;
      pauVar70 = (undefined1 (*) [16])(lVar69 + 2);
      uVar19 = *(undefined8 *)*pauVar70;
      uVar20 = *(undefined8 *)(lVar69 + 10);
      local_b40 = vpmovzxwd_avx2(*pauVar70);
      if (in_ECX == 0) {
        local_168 = uVar66 + 1;
        local_16c = uVar66 + 2;
        local_170 = uVar66 + 3;
        local_174 = uVar66 + 4;
        local_178 = uVar66 + 5;
        local_17c = uVar66 + 6;
        local_180 = uVar66 + 7;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(uVar66),local_168,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_16c,2);
        local_160 = vpinsrd_avx(auVar78._0_16_,local_170,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_174),local_178,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_17c,2);
        auStack_150 = vpinsrd_avx(auVar78._0_16_,local_180,3);
        local_c40 = local_160._0_8_;
        uStack_c38 = local_160._8_8_;
        uStack_c30 = auStack_150._0_8_;
        uStack_c28 = auStack_150._8_8_;
        local_924 = local_c64;
        local_724 = local_c64;
        local_728 = local_c64;
        local_72c = local_c64;
        local_730 = local_c64;
        local_734 = local_c64;
        local_738 = local_c64;
        local_73c = local_c64;
        local_740 = local_c64;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_c64,2);
        local_760 = vpinsrd_avx(auVar78._0_16_,local_c64,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,local_c64,2);
        auStack_750 = vpinsrd_avx(auVar78._0_16_,local_c64,3);
        local_928 = 0x3f;
        in_stack_ffffffffffffe8ec = 0x3f;
        local_6e4 = 0x3f;
        local_6e8 = 0x3f;
        local_6ec = 0x3f;
        local_6f0 = 0x3f;
        local_6f4 = 0x3f;
        local_6f8 = 0x3f;
        local_6fc = 0x3f;
        local_700 = 0x3f;
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,2);
        auVar78._16_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,3);
        auVar78._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,2);
        auVar78._0_16_ = vpinsrd_avx(auVar78._0_16_,0x3f,3);
        auVar78._0_16_ = ZEXT116(0) * auVar78._16_16_ + ZEXT116(1) * auVar78._0_16_;
        auVar78._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar78._16_16_;
        local_720._16_8_ = auVar78._16_8_;
        local_720._24_8_ = auVar78._24_8_;
        local_9a0 = local_760._0_8_;
        uStack_998 = local_760._8_8_;
        uStack_990 = auStack_750._0_8_;
        uStack_988 = auStack_750._8_8_;
        auVar11._16_8_ = auStack_750._0_8_;
        auVar11._0_16_ = local_760;
        auVar11._24_8_ = auStack_750._8_8_;
        auVar10._16_8_ = local_720._16_8_;
        auVar10._0_16_ = auVar78._0_16_;
        auVar10._24_8_ = local_720._24_8_;
        local_600 = vpand_avx2(auVar11,auVar10);
        local_604 = 1;
        local_d00 = vpsrld_avx2(local_600,ZEXT416(1));
        in_stack_ffffffffffffe8e4 = uVar66;
        in_stack_ffffffffffffe8e8 = local_c64;
        _local_b20 = auVar13;
        local_720 = auVar78;
        local_164 = uVar66;
        local_140 = uVar66;
        local_13c = local_168;
        local_138 = local_16c;
        local_134 = local_170;
        local_130 = local_174;
        local_12c = local_178;
        local_128 = local_17c;
        local_124 = local_180;
      }
      else {
        local_b20._0_8_ = auVar13._0_8_;
        local_b20._8_8_ = auVar13._8_8_;
        local_b20._16_8_ = auVar13._16_8_;
        uStack_b08 = auVar13._24_8_;
        local_648 = 7;
        local_64c = 5;
        local_650 = 3;
        local_654 = 1;
        local_658 = 6;
        local_65c = 4;
        local_660 = 2;
        local_664 = 0;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,4,2);
        local_6a0 = vpinsrd_avx(auVar77._0_16_,6,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,5,2);
        auStack_690 = vpinsrd_avx(auVar77._0_16_,7,3);
        local_880 = local_b20._0_8_;
        uStack_878 = local_b20._8_8_;
        uStack_870 = local_b20._16_8_;
        uStack_868 = uStack_b08;
        local_8a0 = local_6a0._0_8_;
        uStack_898 = local_6a0._8_8_;
        uStack_890 = auStack_690._0_8_;
        uStack_888 = auStack_690._8_8_;
        auVar14._16_8_ = auStack_690._0_8_;
        auVar14._0_16_ = local_6a0;
        auVar14._24_8_ = auStack_690._8_8_;
        auVar10 = vpermd_avx2(auVar14,auVar13);
        stack0xfffffffffffff4f0 = auVar10._16_16_;
        local_a00 = stack0xfffffffffffff4f0;
        auStack_b70 = auVar13._0_16_;
        local_b40._8_8_ = uStack_a08;
        local_b40._0_8_ = local_a10;
        local_940 = (undefined1 (*) [16])(in_RDX + 0x10 + (long)(int)uVar66 * 2);
        local_910 = *(undefined8 *)*local_940;
        uStack_908 = *(undefined8 *)(*local_940 + 8);
        auVar13 = vpmovzxwd_avx2(*local_940);
        local_b60._0_8_ = auVar13._0_8_;
        local_b60._8_8_ = auVar13._8_8_;
        local_b60._16_8_ = auVar13._16_8_;
        local_b60._24_8_ = auVar13._24_8_;
        local_6a4 = 7;
        local_6a8 = 5;
        local_6ac = 3;
        local_6b0 = 1;
        local_6b4 = 6;
        local_6b8 = 4;
        local_6bc = 2;
        local_6c0 = 0;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,4,2);
        local_6e0 = vpinsrd_avx(auVar77._0_16_,6,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,5,2);
        auStack_6d0 = vpinsrd_avx(auVar77._0_16_,7,3);
        local_8c0 = local_b60._0_8_;
        uStack_8b8 = local_b60._8_8_;
        uStack_8b0 = local_b60._16_8_;
        uStack_8a8 = local_b60._24_8_;
        local_8e0 = local_6e0._0_8_;
        uStack_8d8 = local_6e0._8_8_;
        uStack_8d0 = auStack_6d0._0_8_;
        uStack_8c8 = auStack_6d0._8_8_;
        auVar12._16_8_ = auStack_6d0._0_8_;
        auVar12._0_16_ = local_6e0;
        auVar12._24_8_ = auStack_6d0._8_8_;
        local_b60 = vpermd_avx2(auVar12,auVar13);
        uStack_a08 = local_b60._24_8_;
        local_a10 = local_b60._16_8_;
        local_a80 = local_b60._0_8_;
        uStack_a78 = local_b60._8_8_;
        uStack_a70 = local_b60._16_8_;
        uStack_a68 = local_b60._24_8_;
        auVar76._0_16_ = ZEXT116(0) * local_b60._0_16_ + ZEXT116(1) * auVar10._0_16_;
        auVar76._16_16_ = ZEXT116(0) * stack0xfffffffffffff4f0 + ZEXT116(1) * local_b60._0_16_;
        uStack_a90 = local_b20._0_8_;
        uStack_a88 = local_b20._8_8_;
        auVar2._8_8_ = uStack_a18;
        auVar2._0_8_ = local_a20;
        local_b40._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * local_b40._0_16_;
        local_b40._16_16_ = ZEXT116(0) * auStack_b70 + ZEXT116(1) * auVar2;
        local_1c8 = uVar66 + 2;
        local_1cc = uVar66 + 4;
        local_1d0 = uVar66 + 6;
        local_1d4 = uVar66 + 8;
        local_1d8 = uVar66 + 10;
        local_1dc = uVar66 + 0xc;
        local_1e0 = uVar66 + 0xe;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(uVar66),local_1c8,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_1cc,2);
        local_1c0 = vpinsrd_avx(auVar77._0_16_,local_1d0,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(local_1d4),local_1d8,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_1dc,2);
        auStack_1b0 = vpinsrd_avx(auVar77._0_16_,local_1e0,3);
        local_c40 = local_1c0._0_8_;
        uStack_c38 = local_1c0._8_8_;
        uStack_c30 = auStack_1b0._0_8_;
        uStack_c28 = auStack_1b0._8_8_;
        local_91c = local_c64;
        local_7a4 = local_c64;
        local_7a8 = local_c64;
        local_7ac = local_c64;
        local_7b0 = local_c64;
        local_7b4 = local_c64;
        local_7b8 = local_c64;
        local_7bc = local_c64;
        local_7c0 = local_c64;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_c64,2);
        local_7e0 = vpinsrd_avx(auVar77._0_16_,local_c64,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(local_c64),local_c64,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,local_c64,2);
        auStack_7d0 = vpinsrd_avx(auVar77._0_16_,local_c64,3);
        local_540 = local_7e0._0_8_;
        uStack_538 = local_7e0._8_8_;
        uStack_530 = auStack_7d0._0_8_;
        uStack_528 = auStack_7d0._8_8_;
        auVar15._16_8_ = auStack_7d0._0_8_;
        auVar15._0_16_ = local_7e0;
        auVar15._24_8_ = auStack_7d0._8_8_;
        local_960 = vpslld_avx2(auVar15,ZEXT416(in_ECX));
        local_920 = 0x3f;
        in_stack_ffffffffffffe8f8 = 0x3f;
        local_764 = 0x3f;
        local_768 = 0x3f;
        local_76c = 0x3f;
        local_770 = 0x3f;
        local_774 = 0x3f;
        local_778 = 0x3f;
        local_77c = 0x3f;
        local_780 = 0x3f;
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,2);
        auVar77._16_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,3);
        auVar77._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,2);
        auVar77._0_16_ = vpinsrd_avx(auVar77._0_16_,0x3f,3);
        auVar77._0_16_ = ZEXT116(0) * auVar77._16_16_ + ZEXT116(1) * auVar77._0_16_;
        auVar77._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar77._16_16_;
        local_7a0._16_8_ = auVar77._16_8_;
        local_7a0._24_8_ = auVar77._24_8_;
        auVar13._16_8_ = local_7a0._16_8_;
        auVar13._0_16_ = auVar77._0_16_;
        auVar13._24_8_ = local_7a0._24_8_;
        local_5c0 = vpand_avx2(local_960,auVar13);
        local_5c4 = 1;
        local_d00 = vpsrld_avx2(local_5c0,ZEXT416(1));
        in_stack_ffffffffffffe8f0 = uVar66;
        in_stack_ffffffffffffe8f4 = local_c64;
        _local_b20 = auVar76;
        local_7a0 = auVar77;
        local_1c4 = uVar66;
        local_1a0 = uVar66;
        local_19c = local_1c8;
        local_198 = local_1cc;
        local_194 = local_1d0;
        local_190 = local_1d4;
        local_18c = local_1d8;
        local_188 = local_1dc;
        local_184 = local_1e0;
      }
      local_500 = local_b40._0_8_;
      uStack_4f8 = local_b40._8_8_;
      uStack_4f0 = local_b40._16_8_;
      uStack_4e8 = local_b40._24_8_;
      local_520 = local_b20._0_8_;
      uStack_518 = local_b20._8_8_;
      uStack_510 = local_b20._16_8_;
      uStack_508 = uStack_b08;
      auVar15 = vpsubd_avx2(local_b40,_local_b20);
      local_580 = local_b20._0_8_;
      uStack_578 = local_b20._8_8_;
      uStack_570 = local_b20._16_8_;
      uStack_568 = uStack_b08;
      local_584 = 5;
      auVar13 = vpslld_avx2(_local_b20,ZEXT416(5));
      local_ba0._0_8_ = auVar13._0_8_;
      local_480 = local_ba0._0_8_;
      local_ba0._8_8_ = auVar13._8_8_;
      uStack_478 = local_ba0._8_8_;
      local_ba0._16_8_ = auVar13._16_8_;
      uStack_470 = local_ba0._16_8_;
      local_ba0._24_8_ = auVar13._24_8_;
      uStack_468 = local_ba0._24_8_;
      local_4a0 = local_860._0_8_;
      uStack_498 = local_860._8_8_;
      uStack_490 = auStack_850._0_8_;
      uStack_488 = auStack_850._8_8_;
      auVar52._16_8_ = auStack_850._0_8_;
      auVar52._0_16_ = auVar79;
      auVar52._24_8_ = auStack_850._8_8_;
      auVar11 = vpaddd_avx2(auVar13,auVar52);
      local_c00._0_8_ = auVar15._0_8_;
      local_440 = local_c00._0_8_;
      local_c00._8_8_ = auVar15._8_8_;
      uStack_438 = local_c00._8_8_;
      local_c00._16_8_ = auVar15._16_8_;
      uStack_430 = local_c00._16_8_;
      local_c00._24_8_ = auVar15._24_8_;
      uStack_428 = local_c00._24_8_;
      local_460 = local_d00._0_8_;
      uStack_458 = local_d00._8_8_;
      uStack_450 = local_d00._16_8_;
      uStack_448 = local_d00._24_8_;
      auVar12 = vpmulld_avx2(auVar15,local_d00);
      local_ba0._0_8_ = auVar11._0_8_;
      local_4c0 = local_ba0._0_8_;
      local_ba0._8_8_ = auVar11._8_8_;
      uStack_4b8 = local_ba0._8_8_;
      local_ba0._16_8_ = auVar11._16_8_;
      uStack_4b0 = local_ba0._16_8_;
      local_ba0._24_8_ = auVar11._24_8_;
      uStack_4a8 = local_ba0._24_8_;
      local_ca0._0_8_ = auVar12._0_8_;
      local_4e0 = local_ca0._0_8_;
      local_ca0._8_8_ = auVar12._8_8_;
      uStack_4d8 = local_ca0._8_8_;
      local_ca0._16_8_ = auVar12._16_8_;
      uStack_4d0 = local_ca0._16_8_;
      local_ca0._24_8_ = auVar12._24_8_;
      uStack_4c8 = local_ca0._24_8_;
      auVar13 = vpaddd_avx2(auVar11,auVar12);
      local_cc0._0_8_ = auVar13._0_8_;
      local_640 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar13._8_8_;
      uStack_638 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar13._16_8_;
      uStack_630 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar13._24_8_;
      uStack_628 = local_cc0._24_8_;
      local_644 = 5;
      auStack_110 = ZEXT416(5);
      auVar14 = vpsrld_avx2(auVar13,auStack_110);
      local_cc0._0_8_ = auVar14._0_8_;
      local_100 = local_cc0._0_8_;
      local_cc0._8_8_ = auVar14._8_8_;
      uStack_f8 = local_cc0._8_8_;
      local_cc0._16_8_ = auVar14._16_8_;
      uStack_f0 = local_cc0._16_8_;
      local_cc0._24_8_ = auVar14._24_8_;
      uStack_e8 = local_cc0._24_8_;
      uVar21 = local_cc0._16_8_;
      uVar22 = local_cc0._24_8_;
      local_120 = local_cc0._16_8_;
      uStack_118 = local_cc0._24_8_;
      auVar57._16_16_ = auStack_110;
      auVar57._0_16_ = auVar14._16_16_;
      auVar10 = vpackusdw_avx2(auVar14,auVar57);
      uStack_b0 = local_820._16_8_;
      uStack_a8 = local_820._24_8_;
      local_e0 = local_c40;
      uStack_d8 = uStack_c38;
      uStack_d0 = uStack_c30;
      uStack_c8 = uStack_c28;
      auVar59._16_8_ = local_820._16_8_;
      auVar59._0_16_ = auVar75._0_16_;
      auVar59._24_8_ = local_820._24_8_;
      auVar58._8_8_ = uStack_c38;
      auVar58._0_8_ = local_c40;
      auVar58._16_8_ = uStack_c30;
      auVar58._24_8_ = uStack_c28;
      auVar13 = vpcmpgtd_avx2(auVar59,auVar58);
      local_c60._0_8_ = auVar13._0_8_;
      local_80 = local_c60._0_8_;
      local_c60._8_8_ = auVar13._8_8_;
      uStack_78 = local_c60._8_8_;
      local_c60._16_8_ = auVar13._16_8_;
      uStack_70 = local_c60._16_8_;
      local_c60._24_8_ = auVar13._24_8_;
      uStack_68 = local_c60._24_8_;
      uVar23 = local_c60._16_8_;
      uVar24 = local_c60._24_8_;
      local_a0 = local_c60._16_8_;
      uStack_98 = local_c60._24_8_;
      auStack_90 = ZEXT416(5);
      auVar60._16_16_ = auStack_90;
      auVar60._0_16_ = auVar13._16_16_;
      auVar13 = vpackssdw_avx2(auVar13,auVar60);
      local_2a0 = uVar26;
      lStack_298 = uVar27;
      uStack_290 = auStack_9f0._0_8_;
      uStack_288 = auStack_9f0._8_8_;
      local_ce0._0_8_ = auVar10._0_8_;
      local_2c0 = local_ce0._0_8_;
      local_ce0._8_8_ = auVar10._8_8_;
      uStack_2b8 = local_ce0._8_8_;
      local_ce0._16_8_ = auVar10._16_8_;
      uStack_2b0 = local_ce0._16_8_;
      local_ce0._24_8_ = auVar10._24_8_;
      uStack_2a8 = local_ce0._24_8_;
      local_c60._0_8_ = auVar13._0_8_;
      local_2e0 = local_c60._0_8_;
      local_c60._8_8_ = auVar13._8_8_;
      uStack_2d8 = local_c60._8_8_;
      local_c60._16_8_ = auVar13._16_8_;
      uStack_2d0 = local_c60._16_8_;
      local_c60._24_8_ = auVar13._24_8_;
      uStack_2c8 = local_c60._24_8_;
      auVar55._16_8_ = auStack_9f0._0_8_;
      auVar55._0_16_ = auVar8;
      auVar55._24_8_ = auStack_9f0._8_8_;
      auVar10 = vpblendvb_avx2(auVar55,auVar10,auVar13);
      local_ce0._0_8_ = auVar10._0_8_;
      lVar25 = local_ce0._0_8_;
      local_ce0._8_8_ = auVar10._8_8_;
      lVar39 = local_ce0._8_8_;
      local_ce0._16_8_ = auVar10._16_8_;
      uVar28 = local_ce0._16_8_;
      local_ce0._24_8_ = auVar10._24_8_;
      uVar29 = local_ce0._24_8_;
      plVar71[(long)local_c68 * 2] = local_ce0._0_8_;
      local_16d0[(long)local_c68 * 2 + 0x11] = local_ce0._8_8_;
      local_c64 = in_R8D + local_c64;
      local_ce0 = auVar10;
      local_cc0 = auVar14;
      local_ca0 = auVar12;
      local_c60 = auVar13;
      local_c00 = auVar15;
      local_ba0 = auVar11;
      local_ac0 = lVar25;
      lStack_ab8 = lVar39;
      uStack_ab0 = uVar28;
      uStack_aa8 = uVar29;
      local_a40 = uVar23;
      uStack_a38 = uVar24;
      local_a30 = uVar21;
      uStack_a28 = uVar22;
      local_938 = pauVar70;
      local_930 = pauVar68;
      local_900 = uVar19;
      uStack_8f8 = uVar20;
      local_8f0 = uVar17;
      uStack_8e8 = uVar18;
      local_c0 = auVar75._0_16_;
    }
  }
  local_820 = auVar10;
  auStack_850 = auVar1;
  local_860 = auVar79;
  auStack_9f0 = auVar9;
  local_10c0 = auVar13;
  auStack_10f0 = auVar7;
  local_1100 = auVar6;
  auStack_1130 = auVar5;
  local_1140 = auVar4;
  auStack_1170 = auVar3;
  local_1180 = auVar2;
  local_15b0 = in_RSI;
  local_15a8 = in_RDI;
  local_13e0 = auVar72._0_16_;
  auStack_13d0 = auVar72._16_16_;
  local_c20 = auVar75._0_16_;
  auStack_c10 = auVar75._16_16_;
  local_f60 = auVar74._0_16_;
  auStack_f50 = auVar74._16_16_;
  local_de0 = auVar73._0_16_;
  auStack_dd0 = auVar73._16_16_;
  local_9c0 = auVar78._0_16_;
  auStack_9b0 = auVar78._16_16_;
  local_980 = auVar77._0_16_;
  auStack_970 = auVar77._16_16_;
  local_f40 = auVar61;
  auStack_f30 = auVar62;
  local_f80 = auVar63;
  auStack_f70 = auVar64;
  highbd_transpose8x8_sse2
            (in_stack_ffffffffffffe8b0,(__m128i *)(local_16d0 + 0xe),(__m128i *)(local_16d0 + 0xc),
             (__m128i *)(local_16d0 + 10),(__m128i *)(local_16d0 + 8),(__m128i *)(local_16d0 + 6),
             (__m128i *)(local_16d0 + 0xe),
             (__m128i *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
             (__m128i *)CONCAT44(in_stack_ffffffffffffe8ec,in_stack_ffffffffffffe8e8),
             (__m128i *)CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0),
             (__m128i *)CONCAT44(in_stack_ffffffffffffe8fc,in_stack_ffffffffffffe8f8),
             (__m128i *)
             CONCAT44(in_stack_ffffffffffffe904,
                      CONCAT22(in_stack_ffffffffffffe902,in_stack_ffffffffffffe900)),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe90e,
                      CONCAT24(in_stack_ffffffffffffe90c,in_stack_ffffffffffffe908)),
             (__m128i *)
             CONCAT17(in_stack_ffffffffffffe917,
                      CONCAT16(in_stack_ffffffffffffe916,
                               CONCAT24(in_stack_ffffffffffffe914,
                                        CONCAT22(in_stack_ffffffffffffe912,in_stack_ffffffffffffe910
                                                )))),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe91e,
                      CONCAT24(in_stack_ffffffffffffe91c,in_stack_ffffffffffffe918)),
             (__m128i *)
             CONCAT26(in_stack_ffffffffffffe926,
                      CONCAT24(in_stack_ffffffffffffe924,
                               CONCAT22(in_stack_ffffffffffffe922,in_stack_ffffffffffffe920))));
  for (local_16d4 = 0; local_16d4 < 8; local_16d4 = local_16d4 + 1) {
    plVar71 = (longlong *)(local_15a8 + local_16d4 * local_15b0 * 2);
    lVar25 = local_16d0[(long)local_16d4 * 2 + 1];
    *plVar71 = local_16d0[(long)local_16d4 * 2];
    plVar71[1] = lVar25;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z3_8x8_avx2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *left,
                                             int upsample_left, int dy,
                                             int bd) {
  __m128i dstvec[8], d[8];
  if (bd < 12) {
    highbd_dr_prediction_z1_8xN_internal_avx2(8, dstvec, left, upsample_left,
                                              dy);
  } else {
    highbd_dr_prediction_32bit_z1_8xN_internal_avx2(8, dstvec, left,
                                                    upsample_left, dy);
  }
  highbd_transpose8x8_sse2(&dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3],
                           &dstvec[4], &dstvec[5], &dstvec[6], &dstvec[7],
                           &d[0], &d[1], &d[2], &d[3], &d[4], &d[5], &d[6],
                           &d[7]);
  for (int i = 0; i < 8; i++) {
    _mm_storeu_si128((__m128i *)(dst + i * stride), d[i]);
  }
}